

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyReceivedPdu.cpp
# Opt level: O3

void __thiscall DIS::ResupplyReceivedPdu::~ResupplyReceivedPdu(ResupplyReceivedPdu *this)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ResupplyReceivedPdu_001b5d50;
  pSVar1 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_start;
  pSVar2 = (this->_supplies).
           super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar3 = pSVar1;
  if (pSVar2 != pSVar1) {
    do {
      (**pSVar3->_vptr_SupplyQuantity)(pSVar3);
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar2);
    (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar1;
  }
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::~vector(&this->_supplies);
  EntityID::~EntityID(&this->_supplyingEntityID);
  EntityID::~EntityID(&this->_receivingEntityID);
  LogisticsFamilyPdu::~LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  return;
}

Assistant:

ResupplyReceivedPdu::~ResupplyReceivedPdu()
{
    _supplies.clear();
}